

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262.c
# Opt level: O1

int h262_gop(bitstream *str,h262_gop *gop)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 1;
  iVar1 = vs_u(str,&gop->drop_frame_flag,1);
  if (iVar1 == 0) {
    iVar1 = vs_u(str,&gop->time_code_hours,5);
    if (iVar1 == 0) {
      iVar1 = vs_u(str,&gop->time_code_minutes,6);
      if (iVar1 == 0) {
        uVar2 = 1;
        iVar1 = vs_mark(str,1,1);
        if (iVar1 == 0) {
          iVar1 = vs_u(str,&gop->time_code_seconds,6);
          if (iVar1 == 0) {
            iVar1 = vs_u(str,&gop->time_code_pictures,6);
            if (iVar1 == 0) {
              uVar2 = 1;
              iVar1 = vs_u(str,&gop->closed_gop,1);
              if (iVar1 == 0) {
                iVar1 = vs_u(str,&gop->broken_link,1);
                uVar2 = (uint)(iVar1 != 0);
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int h262_gop(struct bitstream *str, struct h262_gop *gop) {
	if (vs_u(str, &gop->drop_frame_flag, 1)) return 1;
	if (vs_u(str, &gop->time_code_hours, 5)) return 1;
	if (vs_u(str, &gop->time_code_minutes, 6)) return 1;
	if (vs_mark(str, 1, 1)) return 1;
	if (vs_u(str, &gop->time_code_seconds, 6)) return 1;
	if (vs_u(str, &gop->time_code_pictures, 6)) return 1;
	if (vs_u(str, &gop->closed_gop, 1)) return 1;
	if (vs_u(str, &gop->broken_link, 1)) return 1;
	return 0;
}